

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O1

SelectionManager * __thiscall
OpenMD::SelectionManager::removeAtomsInRigidBodies
          (SelectionManager *__return_storage_ptr__,SelectionManager *this)

{
  ulong *puVar1;
  _func_int **pp_Var2;
  long lVar3;
  StuntDouble *pSVar4;
  _func_int *p_Var5;
  ulong uVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  SelectionSet ssAtoms;
  int local_54;
  SelectionSet local_50;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_38,&this->nObjects_);
  SelectionSet::SelectionSet(&local_50,&local_38);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SelectionSet::clearAll(&local_50);
  SelectionManager(__return_storage_ptr__,this);
  pSVar4 = beginSelected(__return_storage_ptr__,&local_54);
  while (pSVar4 != (StuntDouble *)0x0) {
    if (pSVar4->objType_ == otRigidBody) {
      pp_Var7 = (_func_int **)pSVar4[2].mass_;
      pp_Var2 = pSVar4[2].properties_._vptr_PropertyMap;
      if (pp_Var7 == pp_Var2) {
        p_Var5 = (_func_int *)0x0;
      }
      else {
        p_Var5 = *pp_Var7;
      }
      if (p_Var5 != (_func_int *)0x0) {
        lVar3 = (long)((local_50.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          pp_Var7 = pp_Var7 + 1;
          uVar6 = (ulong)*(int *)(p_Var5 + 0x28);
          uVar8 = uVar6 + 0x3f;
          if (-1 < (long)uVar6) {
            uVar8 = uVar6;
          }
          puVar1 = (ulong *)(lVar3 + ((long)uVar8 >> 6) * 8 + -8 +
                            (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)*(int *)(p_Var5 + 0x28) & 0x3f);
          if (pp_Var7 == pp_Var2) {
            p_Var5 = (_func_int *)0x0;
          }
          else {
            p_Var5 = *pp_Var7;
          }
        } while (p_Var5 != (_func_int *)0x0);
      }
    }
    local_54 = OpenMDBitSet::nextOnBit
                         ((__return_storage_ptr__->ss_).bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_54);
    if (local_54 == -1) {
      pSVar4 = (StuntDouble *)0x0;
    }
    else {
      pSVar4 = (__return_storage_ptr__->stuntdoubles_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start[local_54];
    }
  }
  SelectionSet::operator-=(&__return_storage_ptr__->ss_,&local_50);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_50.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionManager SelectionManager::removeAtomsInRigidBodies() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }
      }
    }

    // Remove the atoms in rigid bodies from our selection set.
    tempSeleMan.ss_ -= ssAtoms;

    return tempSeleMan;
  }